

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

int __thiscall
TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_>::ClassId
          (TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  string *in_RDI;
  allocator<char> *in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  TPZFileEqnStorage<double> *in_stack_fffffffffffffdf0;
  TPZFrontNonSym<double> *in_stack_fffffffffffffe00;
  allocator<char> local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  uVar1 = Hash(in_RDI);
  iVar2 = TPZAbstractFrontMatrix<double>::ClassId
                    ((TPZAbstractFrontMatrix<double> *)in_stack_fffffffffffffe00);
  uVar1 = uVar1 ^ iVar2 * 2;
  TPZFileEqnStorage<double>::TPZFileEqnStorage(in_stack_fffffffffffffdf0);
  iVar2 = TPZFileEqnStorage<double>::ClassId(in_stack_fffffffffffffdf0);
  TPZFrontNonSym<double>::TPZFrontNonSym((TPZFrontNonSym<double> *)CONCAT44(uVar1,iVar2));
  iVar3 = TPZFrontNonSym<double>::ClassId(in_stack_fffffffffffffe00);
  TPZFrontNonSym<double>::~TPZFrontNonSym((TPZFrontNonSym<double> *)0x1ce13d6);
  TPZFileEqnStorage<double>::~TPZFileEqnStorage((TPZFileEqnStorage<double> *)0x1ce13e3);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  return uVar1 ^ iVar2 << 2 ^ iVar3 << 3;
}

Assistant:

int TPZFrontMatrix<TVar,store, front>::ClassId() const{
    return Hash("TPZFrontMatrix") ^ TPZAbstractFrontMatrix<TVar>::ClassId() << 1 ^ store().ClassId() << 2 ^ front().ClassId() << 3;
}